

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Array<kj::_::KeyMaybeVal> *
kj::_::toKeysAndVals
          (Array<kj::_::KeyMaybeVal> *__return_storage_ptr__,
          ArrayPtr<kj::ArrayPtr<const_char>_> *params)

{
  size_t *psVar1;
  ArrayPtr<const_char> *pAVar2;
  char *__s;
  void *pvVar3;
  anon_union_16_1_a8c68091_for_NullableValue<kj::ArrayPtr<const_char>_>_2 *paVar4;
  size_t sVar5;
  long lVar6;
  ArrayPtr<const_char> local_78;
  KeyMaybeVal *local_68;
  long local_60;
  char local_58;
  ArrayPtr<const_char> local_50;
  size_t local_40;
  Array<kj::_::KeyMaybeVal> *local_38;
  
  local_40 = params->size_;
  local_38 = __return_storage_ptr__;
  local_68 = (KeyMaybeVal *)
             HeapArrayDisposer::allocateImpl
                       (0x28,local_40,local_40,
                        HeapArrayDisposer::Allocate_<kj::_::KeyMaybeVal>::construct,
                        ArrayDisposer::Dispose_<kj::_::KeyMaybeVal>::destruct);
  if (params->size_ != 0) {
    pAVar2 = params->ptr;
    paVar4 = &(local_68->val).ptr.field_1;
    local_60 = params->size_ << 4;
    lVar6 = 0;
    do {
      local_78.ptr = (char *)0x0;
      local_78.size_ = 0;
      local_58 = '\0';
      __s = *(char **)((long)&pAVar2->ptr + lVar6);
      pvVar3 = memchr(__s,0x3d,*(size_t *)((long)&pAVar2->size_ + lVar6));
      sVar5 = (long)pvVar3 - (long)__s;
      if (pvVar3 == (void *)0x0) {
        psVar1 = (size_t *)((long)&pAVar2->size_ + lVar6);
        local_78.ptr = (char *)psVar1[-1];
        local_78.size_ = *psVar1;
      }
      else {
        local_78.ptr = __s;
        local_78.size_ = sVar5;
        stripLeadingAndTrailingSpace(&local_78);
        local_50.size_ = *(long *)((long)&pAVar2->size_ + lVar6) - (sVar5 + 1);
        local_50.ptr = __s + sVar5 + 1;
        local_58 = '\x01';
        stripLeadingAndTrailingSpace(&local_50);
      }
      *(char **)((long)paVar4 + -0x18) = local_78.ptr;
      *(size_t *)&paVar4[-1].value = local_78.size_;
      if (((NullableValue<kj::ArrayPtr<const_char>_> *)((long)paVar4 + -8))->isSet == true) {
        ((NullableValue<kj::ArrayPtr<const_char>_> *)((long)paVar4 + -8))->isSet = false;
      }
      if (local_58 == '\x01') {
        (paVar4->value).ptr = local_50.ptr;
        *(size_t *)((long)paVar4 + 8) = local_50.size_;
        ((NullableValue<kj::ArrayPtr<const_char>_> *)((long)paVar4 + -8))->isSet = true;
      }
      paVar4 = (anon_union_16_1_a8c68091_for_NullableValue<kj::ArrayPtr<const_char>_>_2 *)
               ((long)paVar4 + 0x28);
      lVar6 = lVar6 + 0x10;
    } while (local_60 != lVar6);
  }
  local_38->ptr = local_68;
  local_38->size_ = local_40;
  local_38->disposer = (ArrayDisposer *)&HeapArrayDisposer::instance;
  return local_38;
}

Assistant:

kj::Array<KeyMaybeVal> toKeysAndVals(const kj::ArrayPtr<kj::ArrayPtr<const char>>& params) {
  // Given a collection of parameters (a single offer), parse the parameters into <key, MaybeValue>
  // pairs. If the parameter contains an `=`, we set the `key` to everything before, and the `value`
  // to everything after. Otherwise, we set the `key` to be the entire parameter.
  // Either way, both the key and value (if it exists) are stripped of leading & trailing whitespace.
  auto result = kj::heapArray<KeyMaybeVal>(params.size());
  size_t count = 0;
  for (const auto& param : params) {
    kj::ArrayPtr<const char> key;
    kj::Maybe<kj::ArrayPtr<const char>> value;

    KJ_IF_SOME(index, param.findFirst('=')) {
      // Found '=' so we have a value.
      key = param.first(index);
      stripLeadingAndTrailingSpace(key);
      value = param.slice(index + 1, param.size());
      KJ_IF_SOME(v, value) {
        stripLeadingAndTrailingSpace(v);
      }
    } else {
      key = kj::mv(param);
    }

    result[count].key = kj::mv(key);
    result[count].val = kj::mv(value);
    ++count;
  }